

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_flats.cpp
# Opt level: O1

void __thiscall GLFlat::Draw(GLFlat *this,int pass,bool trans)

{
  bool bVar1;
  FMaterial *pFVar2;
  int iVar3;
  
  if (10 < (uint)pass) {
    return;
  }
  iVar3 = gl_weaponlight.Value * extralight;
  switch(pass) {
  case 0:
  case 2:
    gl_SetColor(this->lightlevel,iVar3,&this->Colormap,1.0,false);
    gl_SetFog(this->lightlevel,iVar3,&this->Colormap,false);
    pFVar2 = this->gltexture;
    gl_RenderState.mEffectState = pFVar2->mShaderIndex;
    gl_RenderState.mShaderTimer = (pFVar2->tex->gl_info).shaderspeed;
    if (this->sector->special == 0x5a) {
      iVar3 = 3;
      FMaterial::Bind(pFVar2,3,0);
      DrawSkyboxSector(this,iVar3,false);
      return;
    }
    FMaterial::Bind(pFVar2,0,0);
    pFVar2 = this->gltexture;
    gl_SetPlaneTextureRotation(&this->plane,pFVar2);
    iVar3 = (int)pFVar2;
    bVar1 = -1 < this->dynlightindex || pass == 0;
    goto LAB_0043d4f5;
  case 1:
    if ((!trans) || (this->gltexture != (FMaterial *)0x0)) {
      ProcessLights(this,trans);
      return;
    }
    break;
  case 4:
    if (this->renderstyle == STYLE_Add) {
      if (gl_direct_state_change.Value) {
        (*_ptrc_glBlendFunc)(0x302,1);
      }
      else {
        gl_RenderState.mSrcBlend = 0x302;
        gl_RenderState.mDstBlend = 1;
      }
    }
    gl_SetColor(this->lightlevel,iVar3,&this->Colormap,this->alpha,false);
    gl_SetFog(this->lightlevel,iVar3,&this->Colormap,false);
    if (this->gltexture == (FMaterial *)0x0) {
      gl_RenderState.mAlphaThreshold = -0.001;
      gl_RenderState.mTextureEnabled = false;
      DrawSubsectors(this,iVar3,false,true);
      gl_RenderState.mTextureEnabled = true;
    }
    else {
      bVar1 = FMaterial::GetTransparent(this->gltexture);
      gl_RenderState.mAlphaThreshold = -0.001;
      if (!bVar1) {
        gl_RenderState.mAlphaThreshold = gl_mask_threshold.Value + -0.001;
      }
      pFVar2 = this->gltexture;
      gl_RenderState.mEffectState = pFVar2->mShaderIndex;
      gl_RenderState.mShaderTimer = (pFVar2->tex->gl_info).shaderspeed;
      FMaterial::Bind(pFVar2,0,0);
      pFVar2 = this->gltexture;
      gl_SetPlaneTextureRotation(&this->plane,pFVar2);
      DrawSubsectors(this,(int)pFVar2,(bool)(gl.legacyMode ^ 1),true);
      gl_RenderState.mTextureMatrixEnabled = false;
    }
    if (this->renderstyle == STYLE_Add) {
      if (gl_direct_state_change.Value != false) {
        (*_ptrc_glBlendFunc)(0x302,0x303);
        return;
      }
      gl_RenderState.mSrcBlend = 0x302;
      gl_RenderState.mDstBlend = 0x303;
    }
    break;
  case 7:
  case 9:
  case 10:
    DrawLightsCompat(this,pass);
    return;
  case 8:
    pFVar2 = this->gltexture;
    gl_RenderState.mEffectState = pFVar2->mShaderIndex;
    gl_RenderState.mShaderTimer = (pFVar2->tex->gl_info).shaderspeed;
    FMaterial::Bind(pFVar2,0,0);
    pFVar2 = this->gltexture;
    gl_SetPlaneTextureRotation(&this->plane,pFVar2);
    iVar3 = (int)pFVar2;
    bVar1 = false;
LAB_0043d4f5:
    DrawSubsectors(this,iVar3,bVar1,false);
    gl_RenderState.mTextureMatrixEnabled = false;
  }
  return;
}

Assistant:

void GLFlat::Draw(int pass, bool trans)	// trans only has meaning for GLPASS_LIGHTSONLY
{
	int rel = getExtraLight();

#ifdef _DEBUG
	if (sector->sectornum == gl_breaksec)
	{
		int a = 0;
	}
#endif


	switch (pass)
	{
	case GLPASS_PLAIN:			// Single-pass rendering
	case GLPASS_ALL:			// Same, but also creates the dynlight data.
		gl_SetColor(lightlevel, rel, Colormap,1.0f);
		gl_SetFog(lightlevel, rel, &Colormap, false);
		if (sector->special != GLSector_Skybox)
		{
			gl_RenderState.SetMaterial(gltexture, CLAMP_NONE, 0, -1, false);
			gl_SetPlaneTextureRotation(&plane, gltexture);
			DrawSubsectors(pass, (pass == GLPASS_ALL || dynlightindex > -1), false);
			gl_RenderState.EnableTextureMatrix(false);
		}
		else
		{
			gl_RenderState.SetMaterial(gltexture, CLAMP_XY, 0, -1, false);
			DrawSkyboxSector(pass, (pass == GLPASS_ALL || dynlightindex > -1));
		}
		break;

	case GLPASS_LIGHTSONLY:
		if (!trans || gltexture)
		{
			ProcessLights(trans);
		}
		break;

	case GLPASS_TRANSLUCENT:
		if (renderstyle==STYLE_Add) gl_RenderState.BlendFunc(GL_SRC_ALPHA, GL_ONE);
		gl_SetColor(lightlevel, rel, Colormap, alpha);
		gl_SetFog(lightlevel, rel, &Colormap, false);
		if (!gltexture)	
		{
			gl_RenderState.AlphaFunc(GL_GEQUAL, 0.f);
			gl_RenderState.EnableTexture(false);
			DrawSubsectors(pass, false, true);
			gl_RenderState.EnableTexture(true);
		}
		else 
		{
			if (!gltexture->GetTransparent()) gl_RenderState.AlphaFunc(GL_GEQUAL, gl_mask_threshold);
			else gl_RenderState.AlphaFunc(GL_GEQUAL, 0.f);
			gl_RenderState.SetMaterial(gltexture, CLAMP_NONE, 0, -1, false);
			gl_SetPlaneTextureRotation(&plane, gltexture);
			DrawSubsectors(pass, !gl.legacyMode, true);
			gl_RenderState.EnableTextureMatrix(false);
		}
		if (renderstyle==STYLE_Add) gl_RenderState.BlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
		break;

	case GLPASS_LIGHTTEX:
	case GLPASS_LIGHTTEX_ADDITIVE:
	case GLPASS_LIGHTTEX_FOGGY:
		DrawLightsCompat(pass);
		break;

	case GLPASS_TEXONLY:
		gl_RenderState.SetMaterial(gltexture, CLAMP_NONE, 0, -1, false);
		gl_SetPlaneTextureRotation(&plane, gltexture);
		DrawSubsectors(pass, false, false);
		gl_RenderState.EnableTextureMatrix(false);
		break;
	}
}